

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

float __thiscall
xatlas::internal::segment::Atlas::computeArea(Atlas *this,Chart *chart,uint32_t firstFace)

{
  float *pfVar1;
  uint *puVar2;
  uint index;
  float local_24;
  
  local_24 = chart->area;
  index = firstFace;
  do {
    pfVar1 = Array<float>::operator[](&this->m_faceAreas,index);
    local_24 = local_24 + *pfVar1;
    puVar2 = Array<unsigned_int>::operator[](&this->m_nextPlanarRegionFace,index);
    index = *puVar2;
  } while (index != firstFace);
  return local_24;
}

Assistant:

float computeArea(Chart *chart, uint32_t firstFace) const
	{
		float area = chart->area;
		uint32_t face = firstFace;
		for (;;) { 
			area += m_faceAreas[face];
			face = m_nextPlanarRegionFace[face];
			if (face == firstFace)
				break;
		}
		return area;
	}